

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int makeemitters(int argc,char **argv)

{
  undefined1 auVar1 [16];
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  reference pvVar6;
  Point2i PVar7;
  int *piVar8;
  long *in_RSI;
  string *this;
  float fVar9;
  float fVar10;
  float y1;
  float y0;
  float x1;
  float x0;
  int c_1;
  int c;
  ImageChannelValues p;
  Point2i pp;
  int dx;
  int dy;
  ImageChannelValues pSum;
  int x;
  int y;
  float aspect;
  Point2i res;
  ImageChannelDesc rgbDesc;
  Image *image;
  ImageAndMetadata im;
  anon_class_1_0_00000001 onError;
  int downsampleRate;
  char *filename;
  int in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  undefined4 in_stack_fffffffffffff9e0;
  float in_stack_fffffffffffff9e4;
  undefined4 in_stack_fffffffffffff9e8;
  WrapMode in_stack_fffffffffffff9ec;
  undefined4 in_stack_fffffffffffff9f0;
  Float in_stack_fffffffffffff9f4;
  undefined4 in_stack_fffffffffffff9f8;
  float in_stack_fffffffffffff9fc;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffa00;
  allocator<char> *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  undefined8 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffacc;
  string *psVar11;
  ImageChannelDesc *desc;
  Image *this_00;
  array<pbrt::WrapMode,_2> wrapMode;
  Tuple2<pbrt::Point2,_int> p_00;
  int local_470;
  float local_46c;
  Tuple2<pbrt::Point2,_int> local_468;
  float local_460;
  Tuple2<pbrt::Point2,_int> local_45c;
  int local_454;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  int iVar12;
  char ***in_stack_fffffffffffffbc8;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_428;
  int local_3f8;
  int iStack_3f4;
  int local_3f0;
  int local_3ec;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> local_3e8;
  Tuple2<pbrt::Point2,_int> local_3b4;
  int local_3ac;
  Tuple2<pbrt::Point2,_int> local_3a8;
  int local_3a0;
  float local_39c;
  Tuple2<pbrt::Point2,_int> local_398;
  undefined4 local_390;
  undefined1 local_38c;
  undefined1 local_38b [2];
  allocator<char> local_389;
  Image *local_388;
  string local_380 [32];
  undefined1 local_360 [175];
  allocator<char> local_2b1;
  string local_2b0 [32];
  undefined1 local_290 [591];
  allocator<char> local_41;
  string local_40 [36];
  int local_1c;
  long local_18;
  long *local_10;
  int local_4;
  
  local_18 = 0;
  local_1c = 1;
  local_10 = in_RSI;
  while (*local_10 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa20,
               (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
               in_stack_fffffffffffffa10);
    std::function<void(std::__cxx11::string)>::function<makeemitters(int,char**)::__0&,void>
              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
    bVar2 = pbrt::ParseArg<int*>
                      (in_stack_fffffffffffffbc8,
                       (string *)CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),
                       (int *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x3e30da);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator(&local_41);
    if (!bVar2) {
      if (*(char *)*local_10 == '-') {
        usage("makeemitters","%s: unknown command flag",*local_10);
      }
      else if (local_18 == 0) {
        local_18 = *local_10;
        local_10 = local_10 + 1;
      }
      else {
        usage("makeemitters","multiple input filenames provided.");
      }
    }
  }
  if (local_18 == 0) {
    usage("makeemitters","missing image filename");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             in_stack_fffffffffffffa10);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
             (nullptr_t)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
  pbrt::Image::Read((string *)im.image.p16.nAlloc,(Allocator)im.image.p16.nStored,
                    (ColorEncodingHandle *)im.image.p16.ptr);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  p_00 = (Tuple2<pbrt::Point2,_int>)local_290;
  local_38c = 1;
  local_388 = (Image *)local_380;
  local_360._144_8_ = p_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             in_stack_fffffffffffffa10);
  this_00 = (Image *)local_360;
  wrapMode.values = (WrapMode  [2])((long)local_38b + 1);
  local_388 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             in_stack_fffffffffffffa10);
  local_388 = (Image *)(local_360 + 0x20);
  desc = (ImageChannelDesc *)local_38b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa20,
             (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
             in_stack_fffffffffffffa10);
  local_38c = 0;
  local_360._64_8_ = local_380;
  local_360._72_8_ = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff9ec;
  v._M_array._0_4_ = in_stack_fffffffffffff9e8;
  v._M_len._0_4_ = in_stack_fffffffffffff9f0;
  v._M_len._4_4_ = in_stack_fffffffffffff9f4;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),v);
  requestedChannels.n._0_4_ = in_stack_fffffffffffffac8;
  requestedChannels.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       in_stack_fffffffffffffac0;
  requestedChannels.n._4_4_ = in_stack_fffffffffffffacc;
  pbrt::Image::GetChannelDesc
            ((Image *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
             requestedChannels);
  psVar11 = local_380;
  this = (string *)(local_360 + 0x40);
  do {
    this = this + -0x20;
    std::__cxx11::string::~string(this);
  } while (this != psVar11);
  std::allocator<char>::~allocator((allocator<char> *)local_38b);
  std::allocator<char>::~allocator((allocator<char> *)(local_38b + 1));
  std::allocator<char>::~allocator(&local_389);
  bVar2 = pbrt::ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x3e34a1);
  if (bVar2) {
    local_398 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)local_360._144_8_);
    local_39c = (float)local_398.x / (float)local_398.y;
    printf("AttributeBegin\n");
    printf("Material \"matte\" \"rgb Kd\" [0 0 0]\n");
    local_3a0 = 0;
    while( true ) {
      iVar12 = local_3a0;
      local_3a8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)local_360._144_8_);
      if (local_3a8.y <= iVar12) break;
      local_3ac = 0;
      while( true ) {
        iVar12 = local_3ac;
        local_3b4 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)local_360._144_8_);
        if (local_3b4.x <= iVar12) break;
        pbrt::ImageChannelDesc::size((ImageChannelDesc *)0x3e37b0);
        pbrt::ImageChannelValues::ImageChannelValues
                  ((ImageChannelValues *)in_stack_fffffffffffffa00,
                   CONCAT44(in_stack_fffffffffffff9fc,in_stack_fffffffffffff9f8),
                   in_stack_fffffffffffff9f4);
        for (local_3ec = 0; local_3ec < local_1c; local_3ec = local_3ec + 1) {
          for (local_3f0 = 0; local_3f0 < local_1c; local_3f0 = local_3f0 + 1) {
            pbrt::Point2<int>::Point2
                      ((Point2<int> *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                       in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8);
            if ((local_3f8 < local_398.x) || (iStack_3f4 < local_398.y)) {
              pbrt::WrapMode2D::WrapMode2D
                        ((WrapMode2D *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0)
                         ,in_stack_fffffffffffff9ec);
              pbrt::Image::GetChannels(this_00,(Point2i)p_00,desc,(WrapMode2D)wrapMode.values);
              for (iVar12 = 0; uVar4 = (ulong)iVar12,
                  sVar5 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                          size(&local_428), uVar4 < sVar5; iVar12 = iVar12 + 1) {
                pvVar6 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                         operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0)
                                    ,CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
                fVar10 = *pvVar6;
                pvVar6 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                         operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                     *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0)
                                    ,CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
                *pvVar6 = fVar10 + *pvVar6;
              }
              pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e39e3);
            }
          }
        }
        for (iVar12 = 0; uVar4 = (ulong)iVar12,
            sVar5 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::size
                              (&local_3e8), uVar4 < sVar5; iVar12 = iVar12 + 1) {
          iVar3 = local_1c * local_1c;
          pvVar6 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                   operator[]((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                              CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                              CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
          *pvVar6 = *pvVar6 / (float)iVar3;
        }
        pvVar6 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        fVar10 = *pvVar6;
        pvVar6 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        fVar9 = *pvVar6;
        pvVar6 = pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                            CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        printf("AreaLightSource \"diffuse\" \"rgb L\" [ %f %f %f ]\n",(double)fVar10,(double)fVar9,
               (double)*pvVar6);
        fVar10 = local_39c;
        fVar9 = (float)local_3ac;
        PVar7 = pbrt::Image::Resolution((Image *)local_360._144_8_);
        auVar1 = vfmsub213ss_fma(ZEXT416((uint)(1.0 - fVar9 / (float)PVar7.
                                                  super_Tuple2<pbrt::Point2,_int>.x)),
                                 ZEXT416((uint)fVar10),ZEXT416((uint)(local_39c * 0.5)));
        fVar9 = auVar1._0_4_;
        local_454 = local_3ac + local_1c;
        fVar10 = local_39c;
        piVar8 = std::min<int>(&local_454,&local_398.x);
        iVar12 = *piVar8;
        local_45c = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)local_360._144_8_);
        auVar1 = vfmsub213ss_fma(ZEXT416((uint)(1.0 - (float)iVar12 / (float)local_45c.x)),
                                 ZEXT416((uint)fVar10),ZEXT416((uint)(local_39c * 0.5)));
        fVar10 = auVar1._0_4_;
        in_stack_fffffffffffff9fc = (float)local_3a0;
        in_stack_fffffffffffffa00 =
             (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution((Image *)local_360._144_8_);
        local_468.y = in_stack_fffffffffffffa00.y;
        local_460 = 1.0 - in_stack_fffffffffffff9fc / (float)local_468.y;
        local_470 = local_3a0 + local_1c;
        local_468 = in_stack_fffffffffffffa00;
        piVar8 = std::min<int>(&local_470,&local_398.y);
        in_stack_fffffffffffff9f0 = SUB84(piVar8,0);
        in_stack_fffffffffffff9f4 = (Float)((ulong)piVar8 >> 0x20);
        in_stack_fffffffffffff9e4 = (float)*piVar8;
        PVar7 = pbrt::Image::Resolution((Image *)local_360._144_8_);
        in_stack_fffffffffffff9ec = PVar7.super_Tuple2<pbrt::Point2,_int>.y;
        local_46c = 1.0 - in_stack_fffffffffffff9e4 / (float)(int)in_stack_fffffffffffff9ec;
        printf("Shape \"bilinear\" \"point3 P\" [ %f %f 0 %f %f 0 %f %f 0 %f %f 0 ]\n",(double)fVar9
               ,(double)local_460,(double)fVar10,(double)local_460,(double)fVar9,(double)local_46c);
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3e3de5);
        local_3ac = local_1c + local_3ac;
      }
      local_3a0 = local_1c + local_3a0;
    }
    printf("AttributeEnd\n");
    local_4 = 0;
  }
  else {
    fprintf(_stderr,"%s: didn\'t find R, G, and B channels",local_18);
    local_4 = 1;
  }
  local_390 = 1;
  pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3e3e5d);
  pbrt::ImageAndMetadata::~ImageAndMetadata
            ((ImageAndMetadata *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
  return local_4;
}

Assistant:

int makeemitters(int argc, char *argv[]) {
    const char *filename = nullptr;
    int downsampleRate = 1;

    auto onError = [](const std::string &err) {
        usage("makeemitters", "%s", err.c_str());
        exit(1);
    };
    while (*argv != nullptr) {
        if (ParseArg(&argv, "downsample", &downsampleRate, onError)) {
            // success
        } else if (argv[0][0] == '-')
            usage("makeemitters", "%s: unknown command flag", *argv);
        else if (!filename) {
            filename = *argv;
            ++argv;
        } else
            usage("makeemitters", "multiple input filenames provided.");
    }

    if (filename == nullptr)
        usage("makeemitters", "missing image filename");

    ImageAndMetadata im = Image::Read(filename);
    const Image &image = im.image;

    ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
    if (!rgbDesc) {
        fprintf(stderr, "%s: didn't find R, G, and B channels", filename);
        return 1;
    }

    Point2i res = image.Resolution();
    float aspect = float(res.x) / float(res.y);
    printf("AttributeBegin\n");
    printf("Material \"matte\" \"rgb Kd\" [0 0 0]\n");
    for (int y = 0; y < image.Resolution().y; y += downsampleRate)
        for (int x = 0; x < image.Resolution().x; x += downsampleRate) {
            ImageChannelValues pSum(rgbDesc.size());
            for (int dy = 0; dy < downsampleRate; ++dy)
                for (int dx = 0; dx < downsampleRate; ++dx) {
                    Point2i pp(x + dx, y + dy);
                    if (pp.x >= res.x && pp.y >= res.y)
                        continue;

                    ImageChannelValues p = image.GetChannels(pp, rgbDesc);
                    for (int c = 0; c < p.size(); ++c)
                        pSum[c] += p[c];
                }
            for (int c = 0; c < pSum.size(); ++c)
                pSum[c] /= downsampleRate * downsampleRate;

            printf("AreaLightSource \"diffuse\" \"rgb L\" [ %f %f %f ]\n", pSum[0],
                   pSum[1], pSum[2]);

            float x0 = aspect * (1 - float(x) / image.Resolution().x) - aspect / 2;
            float x1 = aspect * (1 - float(std::min(x + downsampleRate, res.x)) /
                                         image.Resolution().x) -
                       aspect / 2;
            float y0 = 1 - float(y) / image.Resolution().y;
            float y1 =
                1 - float(std::min(y + downsampleRate, res.y)) / image.Resolution().y;
            printf("Shape \"bilinear\" \"point3 P\" [ %f %f 0 %f %f 0 %f %f 0 "
                   "%f %f 0 ]\n",
                   x0, y0, x1, y0, x0, y1, x1, y1);
        }
    printf("AttributeEnd\n");

    return 0;
}